

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressBlock(ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  void *pvVar1;
  size_t sVar2;
  
  pvVar1 = dctx->previousDstEnd;
  if (pvVar1 != dst) {
    dctx->dictEnd = pvVar1;
    dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar1) + (long)dst);
    dctx->prefixStart = dst;
    dctx->previousDstEnd = dst;
  }
  sVar2 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,0);
  dctx->previousDstEnd = (void *)((long)dst + sVar2);
  return sVar2;
}

Assistant:

size_t ZSTD_decompressBlock(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    size_t dSize;
    ZSTD_checkContinuity(dctx, dst);
    dSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 0);
    dctx->previousDstEnd = (char*)dst + dSize;
    return dSize;
}